

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Translator.cpp
# Opt level: O2

void __thiscall
helics::Translator::Translator
          (Translator *this,Core *core,string_view translatorName,InterfaceHandle ihandle)

{
  Interface::Interface(&this->super_Interface,core,ihandle,translatorName);
  (this->super_Interface)._vptr_Interface = (_func_int **)&PTR__Translator_00488120;
  this->disableAssign = false;
  (this->transOp).super___shared_ptr<helics::TranslatorOperations,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)0x0;
  (this->transOp).super___shared_ptr<helics::TranslatorOperations,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  return;
}

Assistant:

Translator::Translator(Core* core, std::string_view translatorName, InterfaceHandle ihandle):
    Interface(core, ihandle, translatorName)
{
}